

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O3

MatrixXd * Tools::CalculateJacobian(MatrixXd *__return_storage_ptr__,VectorXd *x_state)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  double *pdVar4;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_c8;
  float local_a8;
  double local_90;
  double local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  Scalar local_38;
  Scalar local_30;
  float local_28;
  
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,0xc,3,4);
  uVar3 = (x_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if (((((long)uVar3 < 1) || (uVar3 == 1)) || (uVar3 < 3)) || (uVar3 == 3)) {
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0xad,
                  "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                 );
  }
  pdVar4 = (x_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  fVar9 = (float)*pdVar4;
  fVar10 = (float)pdVar4[1];
  dVar1 = pdVar4[2];
  dVar2 = pdVar4[3];
  local_c8.m_xpr = __return_storage_ptr__;
  if ((0.001 <= ABS(fVar9)) || (0.001 <= ABS(fVar10))) {
    fVar7 = fVar9 * fVar9 + fVar10 * fVar10;
    fVar8 = SQRT(fVar7);
    local_88 = (double)(fVar9 / fVar8);
    local_c8.m_row = 0;
    local_c8.m_col = 1;
    local_c8.m_currentBlockRows = 1;
    *(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
     m_storage.m_data = local_88;
    local_90 = (double)(fVar10 / fVar8);
    local_a8 = fVar9;
    local_30 = local_90;
    local_28 = fVar10;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_c8,&local_30);
    local_38 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_38);
    local_40 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_40);
    local_48 = (Scalar)(-local_28 / fVar7);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_48);
    local_50 = (Scalar)(local_a8 / fVar7);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_50);
    local_58 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_58);
    local_60 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_60);
    fVar10 = (float)dVar2 * local_a8;
    fVar9 = (float)dVar1 * local_28;
    local_68 = (Scalar)(((fVar9 - fVar10) * local_28) / (fVar7 * fVar8));
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_68);
    local_70 = (Scalar)(((fVar10 - fVar9) * local_a8) / (fVar7 * fVar8));
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_70);
    local_78 = local_88;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_78);
    local_80 = local_90;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_80);
    lVar6 = ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
            m_storage.m_cols;
    if (local_c8.m_currentBlockRows + local_c8.m_row !=
        ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_rows) {
      if (lVar6 != 0) goto LAB_00130d0b;
      lVar6 = 0;
    }
    if (local_c8.m_col != lVar6) goto LAB_00130d0b;
  }
  else {
    local_c8.m_row = 0;
    local_c8.m_col = 1;
    local_c8.m_currentBlockRows = 1;
    *(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
     m_storage.m_data = 0.0;
    local_30 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_c8,&local_30);
    local_38 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_38);
    local_40 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_40);
    local_48 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_48);
    local_50 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_50);
    local_58 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_58);
    local_60 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_60);
    local_68 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_68);
    local_70 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_70);
    local_78 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar5,&local_78);
    local_80 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar5,&local_80);
    lVar6 = ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
            m_storage.m_cols;
    if (local_c8.m_currentBlockRows + local_c8.m_row !=
        ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_rows) {
      if (lVar6 != 0) goto LAB_00130d0b;
      lVar6 = 0;
    }
    if (local_c8.m_col != lVar6) {
LAB_00130d0b:
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CommaInitializer.h"
                    ,0x6f,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Division by zero",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  return __return_storage_ptr__;
}

Assistant:

MatrixXd Tools::CalculateJacobian(const VectorXd& x_state) {

    MatrixXd Hj(3,4);

    //recover state parameters
    float px = x_state(0);
    float py = x_state(1);
    float vx = x_state(2);
    float vy = x_state(3);
    
    //check division by zero
    if (fabs(px)<0.001 && fabs(py)<0.001) {
        Hj << 0, 0, 0, 0,
              0, 0, 0, 0,
              0, 0, 0, 0;
	std::cout << "Division by zero" << std::endl;
    } else {
        //compute the Jacobian matrix
        float dvdr2 = px*px + py*py;
        float dvdr1 = sqrt(dvdr2);
        float dvdr3 = dvdr1 * dvdr2;
        
        Hj << px/dvdr1,               py/dvdr1,               0,        0,
              -py/dvdr2,              px/dvdr2,               0,        0,
              py*(vx*py-vy*px)/dvdr3, px*(vy*px-vx*py)/dvdr3, px/dvdr1, py/dvdr1;
    }
    
    return Hj;


}